

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.c
# Opt level: O0

void fill_patch(double *ptr,int *dim,int *ld,int ndim,double val)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  double *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  double *arr_1;
  double *arr;
  int stride;
  int j;
  int i;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ECX == 0) {
    GA_Error((char *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  else if (in_ECX != 1) {
    if (in_ECX != 2) {
      for (iVar3 = 0; iVar3 < in_ECX + -1; iVar3 = iVar3 + 1) {
      }
      for (iVar3 = 0; iVar3 < *(int *)in_RSI; iVar3 = iVar3 + 1) {
        fill_patch(in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_XMM0_Qa >> 0x20),
                   (double)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      }
      return;
    }
    for (iVar3 = 0; iVar3 < *(int *)in_RSI; iVar3 = iVar3 + 1) {
      iVar1 = *in_RDX;
      for (iVar2 = 0; iVar2 < *(int *)((long)in_RSI + 4); iVar2 = iVar2 + 1) {
        *(undefined8 *)(in_RDI + (long)(iVar3 * iVar1) * 8 + (long)iVar2 * 8) = in_XMM0_Qa;
      }
    }
    return;
  }
  for (iVar3 = 0; iVar3 < *(int *)in_RSI; iVar3 = iVar3 + 1) {
    *(undefined8 *)(in_RDI + (long)iVar3 * 8) = in_XMM0_Qa;
  }
  return;
}

Assistant:

void fill_patch(double *ptr, int dim[], int ld[], int ndim, double val)
{
     int i, j, stride=1;

     switch (ndim){
     case 0: GA_Error("fill_patch: error",ndim);
     case 1: for(i=0;i <dim[0];i++)ptr[i]=val;
             break;
     case 2: for(i=0; i< dim[0]; i++){
               double *arr = ptr + i*ld[0];
               for(j=0; j< dim[1]; j++)arr[j]=val; 
             }
             break;
     default: 
             for(i=0; i<ndim-1; i++)stride *=ld[i];
             for(i=0; i<dim[0]; i++){
                 double *arr = ptr + stride*i;
                 fill_patch(arr, dim+1, ld+1, ndim-1, val);
             } 
     }
}